

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::WFElemStack::addLevel(WFElemStack *this,XMLCh *toSet,uint toSetLen,uint readerNum)

{
  XMLSize_t XVar1;
  StackElem **ppSVar2;
  int iVar3;
  StackElem *pSVar4;
  undefined4 extraout_var;
  
  if (this->fStackTop == this->fStackCapacity) {
    expandStack(this);
  }
  if (this->fStack[this->fStackTop] == (StackElem *)0x0) {
    pSVar4 = (StackElem *)XMemory::operator_new(0x18,this->fMemoryManager);
    XVar1 = this->fStackTop;
    this->fStack[XVar1] = pSVar4;
    ppSVar2 = this->fStack;
    ppSVar2[XVar1]->fThisElement = (XMLCh *)0x0;
    ppSVar2[XVar1]->fElemMaxLength = 0;
  }
  pSVar4 = this->fStack[this->fStackTop];
  pSVar4->fCurrentURI = this->fUnknownNamespaceId;
  pSVar4->fTopPrefix = -1;
  if (pSVar4->fElemMaxLength < toSetLen) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pSVar4->fThisElement);
    this->fStack[this->fStackTop]->fElemMaxLength = toSetLen;
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(ulong)(toSetLen + 1) * 2);
    this->fStack[this->fStackTop]->fThisElement = (XMLCh *)CONCAT44(extraout_var,iVar3);
  }
  memmove(this->fStack[this->fStackTop]->fThisElement,toSet,(ulong)(toSetLen + 1) * 2);
  XVar1 = this->fStackTop;
  ppSVar2 = this->fStack;
  pSVar4 = ppSVar2[XVar1];
  pSVar4->fReaderNum = readerNum;
  if (XVar1 != 0) {
    pSVar4->fTopPrefix = ppSVar2[XVar1 - 1]->fTopPrefix;
  }
  this->fStackTop = XVar1 + 1;
  return XVar1;
}

Assistant:

XMLSize_t
WFElemStack::addLevel(const XMLCh* const toSet,
                      const unsigned int toSetLen,
                      const unsigned int readerNum)
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fThisElement = 0;
        fStack[fStackTop]->fElemMaxLength = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fTopPrefix = -1;

    // And store the new stuff
    if (toSetLen > fStack[fStackTop]->fElemMaxLength) {

        fMemoryManager->deallocate(fStack[fStackTop]->fThisElement);//delete [] fStack[fStackTop]->fThisElement;
        fStack[fStackTop]->fElemMaxLength = toSetLen;
        fStack[fStackTop]->fThisElement = (XMLCh*) fMemoryManager->allocate
        (
            (toSetLen + 1) * sizeof(XMLCh)
        );//new XMLCh[toSetLen + 1];
    }

    XMLString::moveChars(fStack[fStackTop]->fThisElement, toSet, toSetLen + 1);
    fStack[fStackTop]->fReaderNum = readerNum;

    if (fStackTop != 0)
        fStack[fStackTop]->fTopPrefix = fStack[fStackTop - 1]->fTopPrefix;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}